

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O3

void __thiscall Assimp::BVHLoader::ReadHierarchy(BVHLoader *this,aiScene *pScene)

{
  int iVar1;
  aiNode *paVar2;
  string root;
  string local_58;
  string local_38;
  
  GetNextToken_abi_cxx11_(&local_38,this);
  iVar1 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar1 == 0) {
    paVar2 = ReadNode(this);
    pScene->mRootNode = paVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Expected root node \"ROOT\".","");
  ThrowException(this,&local_58);
}

Assistant:

void BVHLoader::ReadHierarchy( aiScene* pScene)
{
    std::string root = GetNextToken();
    if( root != "ROOT")
        ThrowException( "Expected root node \"ROOT\".");

    // Go read the hierarchy from here
    pScene->mRootNode = ReadNode();
}